

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall
PropertyFailOnEmptyString::~PropertyFailOnEmptyString(PropertyFailOnEmptyString *this)

{
  PropertyFailOnEmptyString *this_local;
  
  ~PropertyFailOnEmptyString(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(FailOnEmptyString, Property)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);
  FailOnEmptyStringInternal myTestA(r, "A", "Property");

  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "Failed (\"\")";
  return !rs.empty() && !rs.front().m_success
    && oss.str().find(expected) != string::npos;
}